

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::MeshLoader::initializeNormalsOffset(MeshLoader *this)

{
  bool bVar1;
  InputShared *pIVar2;
  SourceBase *pSVar3;
  uint uVar4;
  Semantic local_c;
  
  local_c = NORMAL;
  pIVar2 = MeshPrimitiveInputList::getInputBySemantic(&this->mMeshPrimitiveInputs,&local_c);
  if (pIVar2 != (InputShared *)0x0) {
    this->mNormalsOffset = pIVar2->mOffset;
    pSVar3 = SourceArrayLoader::getSourceById
                       (&this->super_SourceArrayLoader,
                        &(pIVar2->super_InputUnshared).mSource.mFragment);
    if (pSVar3 != (SourceBase *)0x0) {
      uVar4 = 0;
      bVar1 = false;
      if (pSVar3->mStride == 3) {
        uVar4 = (uint)(pSVar3->mInitialIndex / 3);
        bVar1 = true;
      }
      goto LAB_00828732;
    }
  }
  uVar4 = 0;
  bVar1 = false;
LAB_00828732:
  this->mNormalsIndexOffset = uVar4;
  this->mUseNormals = bVar1;
  return;
}

Assistant:

void MeshLoader::initializeNormalsOffset ()
    {
        // Check for using normals
        const InputShared* normalInput = mMeshPrimitiveInputs.getNormalInput ();
        if ( normalInput != 0 ) 
        {
            // Get the offset value, the initial index values and alloc the memory.
            mNormalsOffset = normalInput->getOffset ();
            const SourceBase* sourceBase = getSourceById ( normalInput->getSource ().getFragment () );
            if ( !sourceBase )
            {
                mNormalsIndexOffset = 0;
                mUseNormals = false;
            }
            else 
            {
                // only stride 3 makes sense for normals
                unsigned long long stride = sourceBase->getStride();
                if ( stride == 3 )
                {
                    mNormalsIndexOffset = (unsigned int)(sourceBase->getInitialIndex() / stride);
                    mUseNormals = true;
                }
                else
                {
                    mNormalsIndexOffset = 0;
                    mUseNormals = false;
                }
            }
        }
        else
        {
            mNormalsIndexOffset = 0;
            mUseNormals = false;
        }
    }